

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O2

void duckdb::SkipWhitespace(StringCastInputState *input_state)

{
  char *pcVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  
  pcVar1 = input_state->buf;
  puVar2 = input_state->pos;
  puVar3 = input_state->len;
  uVar4 = *puVar2;
  while (((uVar4 < *puVar3 && ((ulong)(byte)pcVar1[uVar4] < 0x21)) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar1[uVar4] & 0x3f) & 1) != 0))) {
    uVar4 = uVar4 + 1;
    *puVar2 = uVar4;
    input_state->escaped = false;
  }
  return;
}

Assistant:

inline static void SkipWhitespace(StringCastInputState &input_state) {
	auto &buf = input_state.buf;
	auto &pos = input_state.pos;
	auto &len = input_state.len;
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
		input_state.escaped = false;
	}
}